

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::BasicMax::CheckIndexed(BasicMax *this,GLenum target,GLint *min_values)

{
  ulong uVar1;
  ulong uVar2;
  CallLogWrapper *this_00;
  long lVar3;
  bool bVar4;
  GLint i;
  GLint64 i64;
  int local_3c;
  int local_38 [2];
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  lVar3 = 0;
  do {
    glu::CallLogWrapper::glGetIntegeri_v(this_00,target,(GLuint)lVar3,&local_3c);
    if (local_3c < min_values[lVar3]) {
      bVar4 = false;
      goto LAB_00c1d146;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  bVar4 = false;
  glu::CallLogWrapper::glGetInteger64i_v(this_00,target,0,(GLint64 *)local_38);
  if (*min_values <= local_38[0]) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (uVar2 == 2) {
        return 1 < uVar2;
      }
      glu::CallLogWrapper::glGetInteger64i_v(this_00,target,(GLuint)(uVar2 + 1),(GLint64 *)local_38)
      ;
      uVar1 = uVar2 + 1;
    } while (min_values[uVar2 + 1] <= local_38[0]);
    bVar4 = 1 < uVar2;
  }
LAB_00c1d146:
  anon_unknown_0::Output("Is %d should be at least %d.\n");
  return bVar4;
}

Assistant:

bool CheckIndexed(GLenum target, const GLint* min_values)
	{
		GLint   i;
		GLint64 i64;

		for (GLuint c = 0; c < 3; c++)
		{
			glGetIntegeri_v(target, c, &i);
			if (i < min_values[c])
			{
				Output("Is %d should be at least %d.\n", i, min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetInteger64i_v(target, c, &i64);
			if (static_cast<GLint>(i64) < min_values[c])
			{
				Output("Is %d should be at least %d.\n", static_cast<GLint>(i64), min_values[c]);
				return false;
			}
		}

		return true;
	}